

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O1

void __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraEclipseCDT4Generator>::
cmExternalMakefileProjectGeneratorSimpleFactory
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraEclipseCDT4Generator> *this,
          string *n,string *doc)

{
  pointer pcVar1;
  string local_60;
  string local_40;
  
  pcVar1 = (n->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar1,pcVar1 + n->_M_string_length)
  ;
  pcVar1 = (doc->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + doc->_M_string_length);
  cmExternalMakefileProjectGeneratorFactory::cmExternalMakefileProjectGeneratorFactory
            (&this->super_cmExternalMakefileProjectGeneratorFactory,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmExternalMakefileProjectGeneratorFactory).
  _vptr_cmExternalMakefileProjectGeneratorFactory =
       (_func_int **)&PTR__cmExternalMakefileProjectGeneratorFactory_009675c0;
  return;
}

Assistant:

cmExternalMakefileProjectGeneratorSimpleFactory(const std::string& n,
                                                  const std::string& doc)
    : cmExternalMakefileProjectGeneratorFactory(n, doc)
  {
  }